

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
hmac_hash::sha1(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
               void *data,size_t length)

{
  SHA1 local_58;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,0x14,(allocator_type *)&local_58);
  local_58.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.m_h[0] = 0x67452301;
  local_58.m_h[1] = 0xefcdab89;
  local_58.m_h[2] = 0x98badcfe;
  local_58.m_h[3] = 0x10325476;
  local_58.m_h[4] = 0xc3d2e1f0;
  local_58.m_transforms = 0;
  SHA1::update(&local_58,(uchar *)data,length);
  SHA1::finish(&local_58,
               (__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_58.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> sha1(const void* data, size_t length) {
        std::vector<uint8_t> digest(hmac_hash::SHA1::DIGEST_SIZE);
        hmac_hash::SHA1 ctx;
        ctx.init();
        ctx.update(reinterpret_cast<const uint8_t*>(data), length);
        ctx.finish(digest.data());
        return digest;
    }